

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

bool __thiscall Memory::Recycler::StartConcurrent(Recycler *this,CollectionState state)

{
  code *pcVar1;
  bool bVar2;
  DWORD DVar3;
  CollectionState newState;
  undefined8 *in_FS_OFFSET;
  CollectionState oldState;
  CollectionState state_local;
  Recycler *this_local;
  
  DVar3 = GetTickCount();
  this->tickCountStartConcurrent = DVar3;
  newState = ObservableValue::operator_cast_to_CollectionState
                       ((ObservableValue *)&this->collectionState);
  SetCollectionState(this,state);
  bVar2 = JsUtil::ThreadService::HasCallback(this->threadService);
  if (bVar2) {
    if (this->concurrentThread != (HANDLE)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1477,"(concurrentThread == 0)","concurrentThread == NULL");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    if (this->concurrentWorkReadyEvent != (HANDLE)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1478,"(concurrentWorkReadyEvent == 0)",
                         "concurrentWorkReadyEvent == NULL");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    bVar2 = JsUtil::ThreadService::Invoke(this->threadService,StaticBackgroundWorkCallback,this);
    if (bVar2) {
      this_local._7_1_ = true;
    }
    else {
      SetCollectionState(this,newState);
      this_local._7_1_ = false;
    }
  }
  else {
    if (this->concurrentThread == (HANDLE)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1484,"(concurrentThread != 0)","concurrentThread != NULL");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    if (this->concurrentWorkReadyEvent == (HANDLE)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1485,"(concurrentWorkReadyEvent != 0)",
                         "concurrentWorkReadyEvent != NULL");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    SetEvent(this->concurrentWorkReadyEvent);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
Recycler::StartConcurrent(CollectionState const state)
{
    // Reset the tick count to detect if the concurrent thread is taking too long
    tickCountStartConcurrent = GetTickCount();

    CollectionState oldState = this->collectionState;
    this->SetCollectionState(state);

    if (threadService->HasCallback())
    {
        Assert(concurrentThread == NULL);
        Assert(concurrentWorkReadyEvent == NULL);

        if (!threadService->Invoke(Recycler::StaticBackgroundWorkCallback, this))
        {
            this->SetCollectionState(oldState);
            return false;
        }

        return true;
    }
    else
    {
        Assert(concurrentThread != NULL);
        Assert(concurrentWorkReadyEvent != NULL);

        SetEvent(concurrentWorkReadyEvent);
        return true;
    }
}